

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::AssbinImporter::CanRead
          (AssbinImporter *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  int iVar1;
  IOStream *pIVar2;
  char local_98 [8];
  char s [32];
  allocator local_59;
  string local_58;
  IOStream *local_38;
  IOStream *in;
  IOSystem *pIStack_28;
  bool param_3_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  AssbinImporter *this_local;
  
  in._7_1_ = param_3;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pFile;
  pFile_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"rb",&local_59);
  pIVar2 = IOSystem::Open(pIOHandler,pFile,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (pIVar2 == (IOStream *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_38 = pIVar2;
    (*pIVar2->_vptr_IOStream[2])(pIVar2,local_98,1,0x20);
    (*pIStack_28->_vptr_IOSystem[5])(pIStack_28,local_38);
    iVar1 = strncmp(local_98,"ASSIMP.binary-dump.",0x13);
    this_local._7_1_ = iVar1 == 0;
  }
  return this_local._7_1_;
}

Assistant:

bool AssbinImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool /*checkSig*/ ) const {
    IOStream * in = pIOHandler->Open(pFile);
    if (nullptr == in) {
        return false;
    }

    char s[32];
    in->Read( s, sizeof(char), 32 );

    pIOHandler->Close(in);

    return strncmp( s, "ASSIMP.binary-dump.", 19 ) == 0;
}